

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_polygon.c
# Opt level: O0

int hit_vertex(int mx,int my)

{
  int iVar1;
  int iVar2;
  int dd;
  int dy;
  int dx;
  int i;
  int my_local;
  int mx_local;
  
  i = 0;
  while( true ) {
    if (ex.vertex_count <= i) {
      return -1;
    }
    iVar1 = (int)(ex.vertices[i].x - (float)mx);
    iVar2 = (int)(ex.vertices[i].y - (float)my);
    if (iVar1 * iVar1 + iVar2 * iVar2 < 0x1a) break;
    i = i + 1;
  }
  return i;
}

Assistant:

static int hit_vertex(int mx, int my)
{
   int i;

   for (i = 0; i < ex.vertex_count; i++) {
      int dx = ex.vertices[i].x - mx;
      int dy = ex.vertices[i].y - my;
      int dd = dx*dx + dy*dy;
      if (dd <= RADIUS * RADIUS)
         return i;
   }

   return -1;
}